

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * vera::toString<double>(string *__return_storage_ptr__,double *_value)

{
  void *this;
  ostringstream local_190 [8];
  ostringstream out;
  double *_value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this = (void *)std::ostream::operator<<(local_190,std::fixed);
  std::ostream::operator<<(this,*_value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const T& _value) {
    std::ostringstream out;
    out << std::fixed << _value;
    return out.str();
}